

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_containers.hpp
# Opt level: O1

string * __thiscall
magic_enum::containers::
bitset<Color,magic_enum::containers::detail::indexing<Color,std::less<Color>,void>>::
to_string_abi_cxx11_(string *__return_storage_ptr__,void *this,char_type sep)

{
  Color pos;
  ulong uVar1;
  bool bVar2;
  undefined **ppuVar3;
  undefined **ppuVar4;
  undefined *__n;
  ulong uVar5;
  char *__s;
  long lVar6;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar6 = 0;
  do {
    pos = *(Color *)((long)&magic_enum::detail::values_v<Color,(magic_enum::detail::enum_subtype)1>
                    + lVar6);
    bVar2 = bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
            ::test((bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
                    *)this,pos);
    if (bVar2) {
      if (__return_storage_ptr__->_M_string_length != 0) {
        Catch::clara::std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
                  (__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,1,sep);
      }
      ppuVar4 = &PTR_typeinfo_00191018;
      uVar1 = 0;
      do {
        uVar5 = uVar1;
        ppuVar3 = ppuVar4;
        ppuVar4 = ppuVar3 + 2;
        if (2 < uVar5) break;
        uVar1 = uVar5 + 1;
      } while (1 << ((byte)uVar5 & 0x1f) != pos);
      __n = (undefined *)0x0;
      __s = (char *)0x0;
      if (uVar5 < 3) {
        __n = ppuVar3[1];
        __s = *ppuVar4;
      }
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::append(__return_storage_ptr__,__s,(size_type)__n);
    }
    lVar6 = lVar6 + 4;
    if (lVar6 == 0xc) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

[[nodiscard]] string to_string(char_type sep = static_cast<char_type>('|')) const {
    string name;

    for (const auto& e : enum_values<E>()) {
      if (test(e)) {
        if (!name.empty()) {
          name.append(1, sep);
        }
        auto n = enum_name(e);
        name.append(n.data(), n.size());
      }
    }
    return name;
  }